

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_recon.c
# Opt level: O0

REF_STATUS ref_recon_abs_value_hessian(REF_GRID ref_grid,REF_DBL *hessian)

{
  uint uVar1;
  REF_DBL local_b0;
  REF_DBL local_a8;
  double local_a0;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_INT node;
  REF_DBL diag_system [12];
  REF_NODE ref_node;
  REF_DBL *hessian_local;
  REF_GRID ref_grid_local;
  
  diag_system[0xb] = (REF_DBL)ref_grid->node;
  ref_private_macro_code_rss_1 = 0;
  do {
    if (*(int *)((long)diag_system[0xb] + 4) <= ref_private_macro_code_rss_1) {
      ref_grid_local._4_4_ = ref_node_ghost_dbl((REF_NODE)diag_system[0xb],hessian,6);
      if (ref_grid_local._4_4_ == 0) {
        ref_grid_local._4_4_ = 0;
      }
      else {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c",
               0x55f,"ref_recon_abs_value_hessian",(ulong)ref_grid_local._4_4_,"update ghosts");
      }
      return ref_grid_local._4_4_;
    }
    if ((((-1 < ref_private_macro_code_rss_1) &&
         (ref_private_macro_code_rss_1 < *(int *)((long)diag_system[0xb] + 4))) &&
        (-1 < *(long *)(*(long *)((long)diag_system[0xb] + 0x10) +
                       (long)ref_private_macro_code_rss_1 * 8))) &&
       (*(int *)(*(long *)((long)diag_system[0xb] + 0x50) + 4) ==
        *(int *)(*(long *)((long)diag_system[0xb] + 0x28) + (long)ref_private_macro_code_rss_1 * 4))
       ) {
      uVar1 = ref_matrix_diag_m(hessian + ref_private_macro_code_rss_1 * 6,
                                (REF_DBL *)&ref_private_macro_code_rss);
      if (uVar1 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c",
               0x557,"ref_recon_abs_value_hessian",(ulong)uVar1,"decomp");
        return uVar1;
      }
      if (_ref_private_macro_code_rss <= 0.0) {
        local_a0 = -_ref_private_macro_code_rss;
      }
      else {
        local_a0 = _ref_private_macro_code_rss;
      }
      _ref_private_macro_code_rss = local_a0;
      if (diag_system[0] <= 0.0) {
        local_a8 = -diag_system[0];
      }
      else {
        local_a8 = diag_system[0];
      }
      diag_system[0] = local_a8;
      if (diag_system[1] <= 0.0) {
        local_b0 = -diag_system[1];
      }
      else {
        local_b0 = diag_system[1];
      }
      diag_system[1] = local_b0;
      uVar1 = ref_matrix_form_m((REF_DBL *)&ref_private_macro_code_rss,
                                hessian + ref_private_macro_code_rss_1 * 6);
      if (uVar1 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c",
               0x55b,"ref_recon_abs_value_hessian",(ulong)uVar1,"re-form");
        return uVar1;
      }
    }
    ref_private_macro_code_rss_1 = ref_private_macro_code_rss_1 + 1;
  } while( true );
}

Assistant:

REF_FCN REF_STATUS ref_recon_abs_value_hessian(REF_GRID ref_grid,
                                               REF_DBL *hessian) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_DBL diag_system[12];
  REF_INT node;

  /* positive eigenvalues to make positive definite */
  each_ref_node_valid_node(ref_node, node) {
    if (ref_node_owned(ref_node, node)) {
      RSS(ref_matrix_diag_m(&(hessian[6 * node]), diag_system), "decomp");
      ref_matrix_eig(diag_system, 0) = ABS(ref_matrix_eig(diag_system, 0));
      ref_matrix_eig(diag_system, 1) = ABS(ref_matrix_eig(diag_system, 1));
      ref_matrix_eig(diag_system, 2) = ABS(ref_matrix_eig(diag_system, 2));
      RSS(ref_matrix_form_m(diag_system, &(hessian[6 * node])), "re-form");
    }
  }

  RSS(ref_node_ghost_dbl(ref_node, hessian, 6), "update ghosts");

  return REF_SUCCESS;
}